

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_extract.cpp
# Opt level: O1

void __thiscall
ktx::CommandExtract::saveEXR
          (CommandExtract *this,string *filepath,bool appendExtension,VkFormat vkFormat,
          FormatDescriptor *format,uint32_t width,uint32_t height,int pixelType,char *data,
          size_t size)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  size_type __n;
  allocator_type local_69;
  string local_68;
  vector<int,_std::allocator<int>_> local_48;
  
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(filepath->_M_dataplus)._M_p;
  paVar1 = &filepath->field_2;
  if (paVar2 == paVar1) {
    local_68.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_68.field_2._8_8_ = *(undefined8 *)((long)&filepath->field_2 + 8);
  }
  else {
    local_68.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_68._M_dataplus._M_p = (pointer)paVar2;
  }
  local_68._M_string_length = filepath->_M_string_length;
  (filepath->_M_dataplus)._M_p = (pointer)paVar1;
  filepath->_M_string_length = 0;
  (filepath->field_2)._M_local_buf[0] = '\0';
  __n = 3;
  if (vkFormat != VK_FORMAT_E5B9G9R9_UFLOAT_PACK32) {
    __n = (size_type)(format->extended).channelCount;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_48,__n,&pixelType,&local_69);
  saveEXR(this,&local_68,appendExtension,vkFormat,format,width,height,&local_48,data,size);
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void CommandExtract::saveEXR(std::string filepath, bool appendExtension,
        VkFormat vkFormat, const FormatDescriptor& format, uint32_t width, uint32_t height,
        int pixelType, const char* data, std::size_t size) {
    saveEXR(std::move(filepath), appendExtension, vkFormat, format, width, height,
            std::vector<int>(vkFormat == VK_FORMAT_E5B9G9R9_UFLOAT_PACK32 ? 3 : format.channelCount(), pixelType),
            data, size);
}